

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void __thiscall
amrex::StreamRetry::StreamRetry
          (StreamRetry *this,string *filename,bool abortonretryfailure,int maxtries)

{
  ostream *poVar1;
  
  this->tries = 0;
  this->maxTries = maxtries;
  this->abortOnRetryFailure = abortonretryfailure;
  std::__cxx11::string::string((string *)&this->fileName,(string *)filename);
  poVar1 = ErrorStream();
  this->sros = poVar1;
  (this->spos)._M_off = 0;
  (this->spos)._M_state.__count = 0;
  (this->spos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this->suffix)._M_dataplus._M_p = (pointer)&(this->suffix).field_2;
  (this->suffix)._M_string_length = 0;
  (this->suffix).field_2._M_local_buf[0] = '\0';
  nStreamErrors = 0;
  return;
}

Assistant:

amrex::StreamRetry::StreamRetry(const std::string &filename,
                                 const bool abortonretryfailure,
                                 const int maxtries)
    : tries(0), maxTries(maxtries),
      abortOnRetryFailure(abortonretryfailure),
      fileName(filename),
      sros(amrex::ErrorStream())    // unused here, just to make the compiler happy
{
  nStreamErrors = 0;
}